

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O0

Variant * Jinx::Impl::ParseValue(Variant *__return_storage_ptr__,String *value,NumericFormat format)

{
  bool bVar1;
  bool local_41;
  double dStack_40;
  bool boolean;
  double number;
  int64_t integer;
  Guid guid;
  NumericFormat format_local;
  String *value_local;
  
  guid.data4._0_4_ = format;
  unique0x100000e5 = value;
  bVar1 = StringToGuid(value,(Guid *)((long)&integer + 4));
  if (bVar1) {
    Variant::Variant(__return_storage_ptr__,(Guid *)((long)&integer + 4));
  }
  else {
    bVar1 = StringToInteger(stack0xffffffffffffffe8,(int64_t *)&number);
    if (bVar1) {
      Variant::Variant(__return_storage_ptr__,(int64_t)number);
    }
    else {
      bVar1 = StringToNumber(stack0xffffffffffffffe8,&stack0xffffffffffffffc0,guid.data4._0_4_);
      if (bVar1) {
        Variant::Variant(__return_storage_ptr__,dStack_40);
      }
      else {
        bVar1 = StringToBoolean(stack0xffffffffffffffe8,&local_41);
        if (bVar1) {
          Variant::Variant(__return_storage_ptr__,(bool)(local_41 & 1));
        }
        else {
          Variant::Variant(__return_storage_ptr__,stack0xffffffffffffffe8);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant ParseValue(const String & value, NumericFormat format)
	{
		Guid guid;
		if (StringToGuid(value, &guid))
			return guid;
		int64_t integer;
		if (StringToInteger(value, &integer))
			return integer;
		double number;
		if (StringToNumber(value, &number, format))
			return number;
		bool boolean;
		if (StringToBoolean(value, &boolean))
			return boolean;
		return value;
	}